

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

void __thiscall MidiInApi::MidiInApi(MidiInApi *this,uint queueSizeLimit)

{
  ulong *puVar1;
  size_t __n;
  
  (this->super_MidiApi).apiData_ = (void *)0x0;
  (this->super_MidiApi).connected_ = false;
  (this->super_MidiApi).errorString_._M_dataplus._M_p =
       (pointer)&(this->super_MidiApi).errorString_.field_2;
  (this->super_MidiApi).errorString_._M_string_length = 0;
  (this->super_MidiApi).errorString_.field_2._M_local_buf[0] = '\0';
  (this->super_MidiApi).errorCallback_ = (RtMidiErrorCallback)0x0;
  (this->super_MidiApi).firstErrorOccurred_ = false;
  (this->super_MidiApi).errorCallbackUserData_ = (void *)0x0;
  (this->inputData_).queue.front = 0;
  (this->inputData_).queue.back = 0;
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiInApi_00110a90;
  (this->inputData_).queue.ring = (MidiMessage *)0x0;
  (this->inputData_).message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inputData_).message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inputData_).message.bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inputData_).message.timeStamp = 0.0;
  (this->inputData_).ignoreFlags = '\a';
  (this->inputData_).doInput = false;
  (this->inputData_).firstMessage = true;
  (this->inputData_).apiData = (void *)0x0;
  (this->inputData_).usingCallback = false;
  (this->inputData_).userCallback = (RtMidiCallback)0x0;
  (this->inputData_).userData = (void *)0x0;
  (this->inputData_).continueSysex = false;
  (this->inputData_).queue.ringSize = queueSizeLimit;
  if (queueSizeLimit != 0) {
    __n = (ulong)queueSizeLimit * 0x20;
    puVar1 = (ulong *)operator_new__(__n + 8);
    *puVar1 = (ulong)queueSizeLimit;
    memset((MidiMessage *)(puVar1 + 1),0,__n);
    (this->inputData_).queue.ring = (MidiMessage *)(puVar1 + 1);
  }
  return;
}

Assistant:

MidiInApi :: MidiInApi( unsigned int queueSizeLimit )
  : MidiApi()
{
  // Allocate the MIDI queue.
  inputData_.queue.ringSize = queueSizeLimit;
  if ( inputData_.queue.ringSize > 0 )
    inputData_.queue.ring = new MidiMessage[ inputData_.queue.ringSize ];
}